

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_shard.c
# Opt level: O1

REF_STATUS ref_shard_mark_cell_edge_split(REF_SHARD ref_shard,REF_INT cell,REF_INT cell_edge)

{
  uint uVar1;
  uint uVar2;
  undefined8 uVar3;
  REF_INT nodes [27];
  REF_INT local_88;
  REF_INT local_84;
  REF_INT local_80;
  REF_INT local_7c;
  REF_INT local_78;
  REF_INT local_74;
  REF_INT local_70;
  REF_INT local_6c;
  
  uVar1 = ref_cell_nodes(ref_shard->grid->cell[0xb],cell,&local_88);
  if (uVar1 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0xac,
           "ref_shard_mark_cell_edge_split",(ulong)uVar1,"cell nodes");
    return uVar1;
  }
  uVar1 = 0;
  if (cell_edge < 8) {
    if (cell_edge == 0) goto LAB_001aaa2d;
    if (cell_edge != 5) {
LAB_001aab4b:
      printf("%s: %d: %s: cell edge %d not implemented, skipping.\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",199,
             "ref_shard_mark_cell_edge_split",(ulong)(uint)cell_edge);
      return 0;
    }
LAB_001aaab3:
    uVar2 = ref_shard_mark_to_split(ref_shard,local_80,local_74);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0xb6,
             "ref_shard_mark_cell_edge_split",(ulong)uVar2,"mark1");
      return uVar2;
    }
    uVar2 = ref_shard_mark_to_split(ref_shard,local_7c,local_78);
    if (uVar2 == 0) goto LAB_001aab41;
    uVar3 = 0xb7;
    uVar1 = uVar2;
  }
  else {
    if (cell_edge == 8) goto LAB_001aaab3;
    if (cell_edge != 0xb) goto LAB_001aab4b;
LAB_001aaa2d:
    uVar2 = ref_shard_mark_to_split(ref_shard,local_84,local_70);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0xb1,
             "ref_shard_mark_cell_edge_split",(ulong)uVar2,"mark1");
      return uVar2;
    }
    uVar2 = ref_shard_mark_to_split(ref_shard,local_88,local_6c);
    if (uVar2 == 0) goto LAB_001aab41;
    uVar3 = 0xb2;
    uVar1 = uVar2;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",uVar3,
         "ref_shard_mark_cell_edge_split",(ulong)uVar1,"mark2");
  uVar2 = uVar1;
LAB_001aab41:
  if (uVar2 == 0) {
    return 0;
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_shard_mark_cell_edge_split(REF_SHARD ref_shard,
                                                  REF_INT cell,
                                                  REF_INT cell_edge) {
  REF_CELL ref_cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];

  ref_cell = ref_grid_hex(ref_shard_grid(ref_shard));

  RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");

  switch (cell_edge) {
    case 0:
    case 11:
      RSS(ref_shard_mark_to_split(ref_shard, nodes[1], nodes[6]), "mark1");
      RSS(ref_shard_mark_to_split(ref_shard, nodes[0], nodes[7]), "mark2");
      break;
    case 5:
    case 8:
      RSS(ref_shard_mark_to_split(ref_shard, nodes[2], nodes[5]), "mark1");
      RSS(ref_shard_mark_to_split(ref_shard, nodes[3], nodes[4]), "mark2");
      break;

      /*
    case 2:  case 6:
      RSS( ref_shard_mark_to_split(ref_shard, nodes[4], nodes[6] ), "mark1" );
      RSS( ref_shard_mark_to_split(ref_shard, nodes[0], nodes[2] ), "mark2" );
      break;
    case 4:  case 7:
      RSS( ref_shard_mark_to_split(ref_shard, nodes[7], nodes[5] ), "mark1" );
      RSS( ref_shard_mark_to_split(ref_shard, nodes[3], nodes[1] ), "mark2" );
      break;
      */

    default:
      printf("%s: %d: %s: cell edge %d not implemented, skipping.\n", __FILE__,
             __LINE__, __func__, cell_edge);
      /*
      RSB( REF_IMPLEMENT, "can not handle cell edge",
           printf("cell edge %d\n",cell_edge););
      */
      break;
  }

  return REF_SUCCESS;
}